

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RemoveContextHook(ImGuiContext *ctx,ImGuiID hook_id)

{
  ImGuiContextHook *pIVar1;
  int local_24;
  int n;
  ImGuiContext *g;
  ImGuiID hook_id_local;
  ImGuiContext *ctx_local;
  
  if (hook_id != 0) {
    for (local_24 = 0; local_24 < (ctx->Hooks).Size; local_24 = local_24 + 1) {
      pIVar1 = ImVector<ImGuiContextHook>::operator[](&ctx->Hooks,local_24);
      if (*(ImGuiID *)pIVar1 == hook_id) {
        pIVar1 = ImVector<ImGuiContextHook>::operator[](&ctx->Hooks,local_24);
        *(undefined4 *)(pIVar1 + 4) = 7;
      }
    }
    return;
  }
  __assert_fail("hook_id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                ,0xea9,"void ImGui::RemoveContextHook(ImGuiContext *, ImGuiID)");
}

Assistant:

void ImGui::RemoveContextHook(ImGuiContext* ctx, ImGuiID hook_id)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook_id != 0);
    for (int n = 0; n < g.Hooks.Size; n++)
        if (g.Hooks[n].HookId == hook_id)
            g.Hooks[n].Type = ImGuiContextHookType_PendingRemoval_;
}